

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O2

void runpprop(runcxdef *ctx,uchar **codepp,objnum callobj,prpnum callprop,objnum obj,prpnum prop,
             int inh,int argc,objnum self)

{
  errcxdef *peVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uchar *puVar5;
  objnum *txt;
  ulong unaff_R13;
  objnum target;
  objnum obj_local;
  byte local_185;
  uint local_184;
  uint local_180;
  int local_17c;
  uint local_178;
  uint local_174;
  runsdef *local_170;
  errdef fr_;
  
  obj_local = obj;
  if (obj == 0xffff) {
    ctx->runcxerr->errcxptr->erraac = 0;
    runsign(ctx,0x410);
  }
  local_17c = argc;
  local_170 = ctx->runcxsp + -(long)argc;
  bVar2 = 1;
  local_180 = (uint)prop;
  local_184 = (uint)callobj;
  local_174 = (uint)callprop;
  local_178 = (uint)self;
  do {
    unaff_R13 = unaff_R13 & 0xffffffff;
    uVar3 = objgetap(ctx->runcxmem,obj_local,(prpnum)local_180,&target,inh);
    if (uVar3 == 0) {
LAB_001338f8:
      ctx->runcxsp->runstyp = '\x05';
      ctx->runcxsp = ctx->runcxsp + 1;
      return;
    }
    local_185 = bVar2;
    puVar5 = mcmlck(ctx->runcxmem,target);
    iVar4 = _setjmp((__jmp_buf_tag *)fr_.errbuf);
    fr_.errcode = iVar4;
    if (iVar4 != 0) {
      ctx->runcxerr->errcxptr = fr_.errprv;
      mcmunlck(ctx->runcxmem,target);
      if (iVar4 - 0x3fcU < 0xfffffff9) {
        dbgds(ctx->runcxdbg);
      }
      errrse1(ctx->runcxerr,&fr_);
    }
    fr_.errprv = ctx->runcxerr->errcxptr;
    ctx->runcxerr->errcxptr = &fr_;
    txt = (objnum *)(puVar5 + (ulong)uVar3 + 6);
    bVar2 = puVar5[(ulong)uVar3 + 2];
    if (bVar2 == 0x10) {
      self = *txt;
    }
    else if (bVar2 == 9) {
      outfmt(ctx->runcxtio,(uchar *)txt);
    }
    else if (bVar2 != 0xe) {
      if (bVar2 == 6) {
        if (codepp != (uchar **)0x0) {
          uVar3 = runcpsav(ctx,codepp,(objnum)local_184,(prpnum)uVar3);
          unaff_R13 = (ulong)uVar3;
        }
        runexe(ctx,(uchar *)txt,(objnum)local_178,target,(prpnum)local_180,local_17c);
        if (codepp != (uchar **)0x0) {
          puVar5 = mcmlck(ctx->runcxmem,(mcmon)local_184);
          *codepp = puVar5 + unaff_R13;
        }
      }
      else {
        runpbuf(ctx,(uint)bVar2,txt);
      }
    }
    mcmunlck(ctx->runcxmem,target);
    if (bVar2 == 0x10) {
      runpprop(ctx,codepp,(objnum)local_184,(prpnum)local_174,self,(prpnum)local_180,0,local_17c,
               self);
    }
    peVar1 = ctx->runcxerr;
    peVar1->errcxptr = fr_.errprv;
    if (bVar2 != 0xe) {
      if (ctx->runcxsp != local_170) {
        return;
      }
      goto LAB_001338f8;
    }
    if ((local_185 & 1) == 0) {
      ctx->runcxerr->errcxptr->erraac = 0;
      runsign(ctx,0x40c);
    }
    if (codepp != (uchar **)0x0) {
      uVar3 = runcpsav(ctx,codepp,(objnum)local_184,(prpnum)peVar1);
      unaff_R13 = (ulong)uVar3;
    }
    (*ctx->runcxdmd)(ctx->runcxdmc,obj_local,(prpnum)local_180);
    bVar2 = 0;
    if (codepp != (uchar **)0x0) {
      puVar5 = mcmlck(ctx->runcxmem,(mcmon)local_184);
      *codepp = puVar5 + unaff_R13;
      bVar2 = 0;
    }
  } while( true );
}

Assistant:

void runpprop(runcxdef *ctx, uchar *noreg *codepp,
              objnum callobj, prpnum callprop,
              noreg objnum obj, prpnum prop, int inh, int argc, objnum self)
{
    uint     pofs;
    uint     saveofs;
    objdef  *objptr;
    prpdef  *prpptr;
    uchar   *val;
    int      typ;
    runsdef  sval;
    objnum   target;
    int      times_through = 0;
    int      err;
	objnum   otherobj;
	runsdef *sp_ret;

	NOREG((&obj, &codepp));

	/* 
	 *   Note the initial stack pointer before arguments.  This is the stack
	 *   slot where the caller expects the return value to be placed on
	 *   return. 
	 */
	sp_ret = ctx->runcxsp - argc;

    if (obj == MCMONINV) runsig(ctx, ERR_RUNNOBJ);
    
startover:
    pofs = objgetap(ctx->runcxmem, obj, prop, &target, inh);
    
    /* if nothing was found, push nil */
    if (!pofs)
    {
		runpush(ctx, DAT_NIL, &sval);
        return;
    }

    /* found a property; get the prpdef, and the value and type of data */
    objptr = mcmlck(ctx->runcxmem, target);
    ERRBEGIN(ctx->runcxerr)         /* catch errors so we can unlock object */

    prpptr = (prpdef *)(((uchar *)objptr) + pofs);
    val = prpvalp(prpptr);
    typ = prptype(prpptr);

    /* determine what to do based on property type */
    switch(typ)
    {
    case DAT_CODE:
        /* save caller's code offset - caller's object may move */
        if (codepp)
            saveofs = runcpsav(ctx, codepp, callobj, callprop);
        
        /* execute the code */
        runexe(ctx, val, self, target, prop, argc);
        
        /* restore caller's code pointer in case object moved */
        if (codepp)
            *codepp = runcprst(ctx, saveofs, callobj, callprop);
        break;

    case DAT_REDIR:
        otherobj = osrp2(val);
        break;

    case DAT_DSTRING:
        outfmt(ctx->runcxtio, val);
        break;
        
    case DAT_DEMAND:
        break;
        
    default:
        runpbuf(ctx, typ, val);
        break;
    }

    /* we're done - unlock the object */
    mcmunlck(ctx->runcxmem, target);

    /* if it's redirected, redirect it now */
    if (typ == DAT_REDIR)
    {
        runpprop(ctx, codepp, callobj, callprop, otherobj, prop,
                 FALSE, argc, otherobj);
    }

    /* if an error occurs, unlock the object, and resignal the error */
    ERRCATCH(ctx->runcxerr, err)
        mcmunlck(ctx->runcxmem, target);
        if (err < ERR_RUNEXIT || err > ERR_RUNEXITOBJ)
            dbgdump(ctx->runcxdbg);                       /* dump the stack */
        errrse(ctx->runcxerr);
    ERREND(ctx->runcxerr)

    /* apply special handling for set-on-first-use data */
    if (typ == DAT_DEMAND)
    {
        /*
         *   if we've already done this, the property isn't being set by
         *   the callback, so we'll never get out of this loop - abort if
         *   so 
         */
        if (++times_through != 1)
            runsig(ctx, ERR_DMDLOOP);

        /* save caller's code offset - caller's object may move */
        if (codepp)
            saveofs = runcpsav(ctx, codepp, callobj, callprop);

        /* invoke the callback to set the property on demand */
        (*ctx->runcxdmd)(ctx->runcxdmc, obj, prop);

        /* restore caller's code pointer */
        if (codepp)
            *codepp = runcprst(ctx, saveofs, callobj, callprop);

        /* try again now that it's been set up */
        goto startover;
	}

	/* 
	 *   If the property invocation didn't push a return value onto the
	 *   stack, push nil as the default result.  *All* property calls must
	 *   yield a value, since our caller might assume that they can pop a
	 *   result.  If the caller pops a result and we don't provide one, the
	 *   stack will be corrupted.  To ensure this doesn't happen, push a
	 *   default nil result if the stack pointer is where it was before the
	 *   caller pushed our arguments.
	 */
	if (ctx->runcxsp == sp_ret)
		runpush(ctx, DAT_NIL, &sval);
}